

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O1

void __thiscall
YAML::detail::node_data::push_back(node_data *this,node *node,shared_memory_holder *param_2)

{
  pointer *pppnVar1;
  pointer ppnVar2;
  iterator __position;
  BadPushback *this_00;
  node *local_18;
  
  if (this->m_type < Scalar) {
    this->m_type = Sequence;
    ppnVar2 = (this->m_sequence).
              super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_sequence).
        super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppnVar2) {
      (this->m_sequence).
      super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppnVar2;
    }
    this->m_seqSize = 0;
  }
  if (this->m_type == Sequence) {
    __position._M_current =
         (this->m_sequence).
         super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_sequence).
        super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_18 = node;
      std::vector<YAML::detail::node*,std::allocator<YAML::detail::node*>>::
      _M_realloc_insert<YAML::detail::node*>
                ((vector<YAML::detail::node*,std::allocator<YAML::detail::node*>> *)
                 &this->m_sequence,__position,&local_18);
    }
    else {
      *__position._M_current = node;
      pppnVar1 = &(this->m_sequence).
                  super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppnVar1 = *pppnVar1 + 1;
    }
    return;
  }
  this_00 = (BadPushback *)__cxa_allocate_exception(0x40);
  BadPushback::BadPushback(this_00);
  __cxa_throw(this_00,&BadPushback::typeinfo,BadFile::~BadFile);
}

Assistant:

void node_data::push_back(node& node,
                          const shared_memory_holder& /* pMemory */) {
  if (m_type == NodeType::Undefined || m_type == NodeType::Null) {
    m_type = NodeType::Sequence;
    reset_sequence();
  }

  if (m_type != NodeType::Sequence)
    throw BadPushback();

  m_sequence.push_back(&node);
}